

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

ostream * AixLog::operator<<(ostream *os,Tag *tag)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  
  poVar2 = (ostream *)&std::clog;
  if (*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) != 0) {
    poVar2 = (ostream *)
             __dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                     *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                            &Log::typeinfo,0);
    if (poVar2 != (ostream *)0x0) {
      std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(poVar2 + 0x148))->__data);
      Tag::operator=((Tag *)(poVar2 + 0x88),(Tag *)os);
      iVar1 = pthread_mutex_unlock((pthread_mutex_t *)(poVar2 + 0x148));
      return (ostream *)CONCAT44(extraout_var,iVar1);
    }
  }
  if (os[0x28] != (ostream)0x0) {
    return poVar2;
  }
  poVar2 = std::operator<<((ostream *)&std::clog,(string *)(os + 8));
  return poVar2;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const Tag& tag) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    log->metadata_.tag = tag;
  } else if (tag) {
    os << tag.text;
  }
  return os;
}